

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

string * __thiscall
upb::generator::ArchDependentSize_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,int64_t size32,int64_t size64)

{
  AlphaNum *a;
  Arg *in_R9;
  string_view format;
  Arg local_c0;
  Arg local_90;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  AlphaNum local_50;
  int64_t local_20;
  int64_t size64_local;
  int64_t size32_local;
  
  local_20 = size32;
  size64_local = (int64_t)this;
  size32_local = (int64_t)__return_storage_ptr__;
  if (this == (generator *)size32) {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_50,(long)this);
    absl::lts_20250127::StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_50,a);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_60,"UPB_SIZE($0, $1)");
    absl::lts_20250127::substitute_internal::Arg::Arg(&local_90,size64_local);
    absl::lts_20250127::substitute_internal::Arg::Arg(&local_c0,local_20);
    format._M_str = (char *)&local_90;
    format._M_len = (size_t)local_60._M_str;
    absl::lts_20250127::Substitute_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)local_60._M_len,format,&local_c0,in_R9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ArchDependentSize(int64_t size32, int64_t size64) {
  if (size32 == size64) return absl::StrCat(size32);
  return absl::Substitute("UPB_SIZE($0, $1)", size32, size64);
}